

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O2

sockaddr_in mario::sockets::getPeerAddr(int sockfd)

{
  sockaddr_in sVar1;
  int iVar2;
  Writer *this;
  socklen_t addrlen;
  sockaddr_in peeraddr;
  Writer local_80;
  
  peeraddr.sin_family = 0;
  peeraddr.sin_port = 0;
  peeraddr.sin_addr.s_addr = 0;
  peeraddr.sin_zero[0] = '\0';
  peeraddr.sin_zero[1] = '\0';
  peeraddr.sin_zero[2] = '\0';
  peeraddr.sin_zero[3] = '\0';
  peeraddr.sin_zero[4] = '\0';
  peeraddr.sin_zero[5] = '\0';
  peeraddr.sin_zero[6] = '\0';
  peeraddr.sin_zero[7] = '\0';
  addrlen = 0x10;
  iVar2 = getpeername(sockfd,(sockaddr *)&peeraddr,&addrlen);
  if (iVar2 < 0) {
    local_80._vptr_Writer = (_func_int **)&PTR__Writer_00134ae0;
    local_80.m_msg = (LogMessage *)0x0;
    local_80.m_level = Fatal;
    local_80.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/SocketsOps.cpp"
    ;
    local_80.m_line = 0x69;
    local_80.m_func = "struct sockaddr_in mario::sockets::getPeerAddr(int)";
    local_80.m_verboseLevel = 0;
    local_80.m_logger = (Logger *)0x0;
    local_80.m_proceed = false;
    local_80.m_messageBuilder.m_logger = (Logger *)0x0;
    local_80.m_messageBuilder.m_containerLogSeperator = "";
    local_80.m_dispatchAction = NormalLog;
    local_80.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_80.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_80.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this = el::base::Writer::construct(&local_80,1,"default");
    el::base::Writer::operator<<(this,(char (*) [21])"sockets::getPeerAddr");
    el::base::Writer::~Writer(&local_80);
  }
  sVar1.sin_zero[0] = peeraddr.sin_zero[0];
  sVar1.sin_zero[1] = peeraddr.sin_zero[1];
  sVar1.sin_zero[2] = peeraddr.sin_zero[2];
  sVar1.sin_zero[3] = peeraddr.sin_zero[3];
  sVar1.sin_zero[4] = peeraddr.sin_zero[4];
  sVar1.sin_zero[5] = peeraddr.sin_zero[5];
  sVar1.sin_zero[6] = peeraddr.sin_zero[6];
  sVar1.sin_zero[7] = peeraddr.sin_zero[7];
  sVar1.sin_family = peeraddr.sin_family;
  sVar1.sin_port = peeraddr.sin_port;
  sVar1.sin_addr.s_addr = peeraddr.sin_addr.s_addr;
  return sVar1;
}

Assistant:

struct sockaddr_in sockets::getPeerAddr(int sockfd) {
    struct sockaddr_in peeraddr;
    bzero(&peeraddr, sizeof(peeraddr));
    socklen_t addrlen = sizeof(peeraddr);
    if (::getpeername(sockfd, sockaddr_cast(&peeraddr), &addrlen) < 0) {
        LOG(FATAL) << "sockets::getPeerAddr";
    }
    return peeraddr;
}